

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

int DecoNameToClass(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *ti;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  PClass *desttype;
  PClass *local_38;
  PClass *cls;
  FName clsname;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  cls._4_4_ = numret;
  _clsname = ret;
  if (numparam != 2) {
    __assert_fail("numparam == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1312,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numret != 1) {
    __assert_fail("numret == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1313,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\0') {
    __assert_fail("param[0].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1314,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    if (ret->RegType == '\x03') {
      FName::FName((FName *)&cls,(param->field_0).i);
      FName::FName((FName *)((long)&desttype + 4),(FName *)&cls);
      local_38 = PClass::FindClass((FName *)((long)&desttype + 4));
      ti = (PClass *)(param->field_0).field_1.a;
      bVar1 = PClass::IsDescendantOf(local_38,ti);
      if (!bVar1) {
        pcVar2 = FName::GetChars((FName *)&cls);
        pcVar3 = FName::GetChars(&(ti->super_PStruct).super_PNamedType.TypeName);
        Printf("class \'%s\' is not compatible with \'%s\'",pcVar2,pcVar3);
        local_38 = (PClass *)0x0;
      }
      VMReturn::SetPointer(_clsname,local_38,1);
      return 1;
    }
    __assert_fail("ret->RegType == REGT_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1316,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[1].Type == REGT_POINTER",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x1315,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

int DecoNameToClass(VMFrameStack *stack, VMValue *param, int numparam, VMReturn *ret, int numret)
{
	assert(numparam == 2);
	assert(numret == 1);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	assert(ret->RegType == REGT_POINTER);

	FName clsname = ENamedName(param[0].i);
	const PClass *cls = PClass::FindClass(clsname);
	const PClass *desttype = reinterpret_cast<PClass *>(param[0].a);

	if (!cls->IsDescendantOf(desttype))
	{
		Printf("class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
		cls = NULL;
	}
	ret->SetPointer(const_cast<PClass *>(cls), ATAG_OBJECT);
	return 1;
}